

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int i;
  int iVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  byte bVar31;
  uint uVar32;
  bool bVar33;
  uint uVar34;
  TransportMode TVar35;
  ulong uVar36;
  uint64_t oldstate;
  long in_FS_OFFSET;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Float FVar39;
  float extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar43 [16];
  undefined1 auVar66 [56];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar71 [16];
  undefined1 auVar86 [56];
  undefined1 auVar82 [64];
  ulong in_XMM2_Qb;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  SampledSpectrum SVar94;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f VVar95;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f w;
  SampledSpectrum beta;
  Float g;
  optional<pbrt::BSDFSample> wis;
  Float f;
  optional<pbrt::PhaseFunctionSample> ps;
  Float pdf;
  optional<pbrt::BSDFSample> wos;
  Vector3f local_1f8;
  TransportMode TStack_1ec;
  undefined1 local_1e8 [4];
  float afStack_1e4 [3];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_1b0;
  ushort local_19a;
  float local_198;
  float local_194;
  uint local_190;
  float local_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float afStack_170 [2];
  Vector3f local_168 [2];
  bool local_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  ulong local_138;
  ulong uStack_130;
  undefined1 local_128 [4];
  Vector3f VStack_124;
  Vector3f local_118 [2];
  bool local_fc;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_f8;
  float local_e8;
  uint uStack_e4;
  undefined4 uStack_e0;
  uint uStack_dc;
  undefined1 local_d8 [4];
  float afStack_d4 [4];
  uint local_c4;
  uint local_c0;
  TransportMode local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float afStack_60 [9];
  bool local_3c;
  Vector3f wo_03;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  
  uStack_e0 = 0;
  local_e8 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_138 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar60._4_60_ = wo._12_60_;
  auVar60._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_a8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_78 = auVar60._0_16_;
  uStack_130 = in_XMM2_Qb;
  uStack_a0 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (auVar60._0_4_ < 0.0)) {
    local_78._0_8_ = CONCAT44(wo._12_4_,auVar60._0_4_) ^ 0x8000000080000000;
    local_78._8_4_ = wo._16_4_ ^ 0x80000000;
    local_78._12_4_ = wo._20_4_ ^ 0x80000000;
    local_e8 = -local_e8;
    in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
    uStack_e0 = 0x80000000;
    in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
    local_a8 = local_a8 ^ 0x8000000080000000;
    uStack_a0 = in_XMM0_Qb ^ 0x8000000080000000;
    local_138 = local_138 ^ 0x8000000080000000;
    uStack_130 = in_XMM2_Qb ^ 0x8000000080000000;
  }
  local_f8.bottom = (ConductorBxDF *)0x0;
  fVar91 = local_78._0_4_;
  local_1b0.bottom = &this->bottom;
  local_188 = 0.0;
  fStack_184 = 0.0;
  fStack_180 = 0.0;
  fStack_17c = 0.0;
  local_88.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
  if (0.0 < fVar91) {
    local_88.top = &this->top;
  }
  local_88.bottom = local_1b0.bottom;
  if (0.0 < fVar91) {
    local_88.bottom = local_f8.bottom;
  }
  bVar33 = 0.0 < local_e8 * fVar91 == 0.0 < fVar91;
  local_1b0.top = (DielectricInterfaceBxDF *)local_f8.bottom;
  local_f8.top = &this->top;
  if (bVar33) {
    local_f8.bottom = local_1b0.bottom;
    local_1b0.top = &this->top;
    local_1b0.bottom = (ConductorBxDF *)0x0;
    local_f8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
  }
  local_98._0_4_ = this->thickness;
  local_98._4_4_ = 0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  TStack_1ec = mode;
  uStack_e4 = in_XMM3_Db;
  uStack_dc = in_XMM3_Dd;
  if (0.0 < local_e8 * fVar91) {
    local_98 = ZEXT416((uint)local_98._0_4_);
    bVar31 = (this->config).nSamples;
    VVar95.super_Tuple3<pbrt::Vector3,_float>.z = fVar91;
    VVar95.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
    VVar95.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
    auVar86 = ZEXT856(local_78._8_8_);
    auVar66 = ZEXT856(uStack_a0);
    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
    SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                       (&local_88,VVar95,wi_00,mode);
    auVar82._0_8_ = SVar94.values.values._8_8_;
    auVar82._8_56_ = auVar86;
    auVar61._0_8_ = SVar94.values.values._0_8_;
    auVar61._8_56_ = auVar66;
    auVar38 = vmovlhps_avx(auVar61._0_16_,auVar82._0_16_);
    fStack_17c = (float)bVar31;
    local_188 = auVar38._0_4_ * fStack_17c;
    fStack_184 = auVar38._4_4_ * fStack_17c;
    fStack_180 = auVar38._8_4_ * fStack_17c;
    fStack_17c = auVar38._12_4_ * fStack_17c;
  }
  fVar91 = 0.0;
  if ((this->config).nSamples != '\0') {
    local_98._0_4_ = (uint)bVar33 * local_98._0_4_;
    uVar36 = local_a8 * -0x395b586ca42e166b;
    uVar36 = (CONCAT44((int)(uVar36 >> 0x20),local_78._0_4_) ^
             ((uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    uVar36 = (*Options & 0xffffff ^ uVar36 ^ 0x1a929e4d6f47a654 ^
             (uVar36 >> 0x2f | (ulong)(*Options & 0xff000000))) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    lVar1 = (uVar36 >> 0x2f ^ uVar36) * 2 + 1;
    uVar4 = vcmpss_avx512f((undefined1  [16])0x0,local_78,1);
    local_19a = (ushort)uVar4 & 1;
    uVar36 = (CONCAT44(0x4fb7dae8,local_e8) ^
             ((local_138 * -0x395b586ca42e166b >> 0x2f ^ local_138 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * 0x5851f42d4c957f2d + lVar1 * 0x5851f42d4c957f2e;
    uVar34 = 0;
    local_bc = (TransportMode)(TStack_1ec == Radiance);
    TVar35 = TStack_1ec;
    do {
      uVar32 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
      bVar31 = (byte)(uVar36 >> 0x3b);
      auVar38._4_12_ = in_register_00001384;
      auVar38._0_4_ = in_XMM6_Da;
      auVar38 = vcvtusi2ss_avx512f(auVar38,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31);
      uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
      auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      uVar28 = uVar36 * 0x5851f42d4c957f2d + lVar1;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar36;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar28;
      auVar41 = vpunpcklqdq_avx(auVar40,auVar68);
      auVar37 = vpsrlvq_avx2(auVar41,_DAT_0044e860);
      auVar40 = vpsrlvq_avx2(auVar41,_DAT_0044e870);
      auVar41 = vpsrlq_avx(auVar41,0x3b);
      auVar41 = vpshufd_avx(auVar41,0xe8);
      uVar36 = uVar28 * 0x5851f42d4c957f2d + lVar1;
      auVar37 = vpshufd_avx(auVar37 ^ auVar40,0xe8);
      auVar41 = vprorvd_avx512vl(auVar37,auVar41);
      auVar37 = vcvtudq2ps_avx512vl(auVar41);
      auVar41._8_4_ = 0x2f800000;
      auVar41._0_8_ = 0x2f8000002f800000;
      auVar41._12_4_ = 0x2f800000;
      auVar41 = vmulps_avx512vl(auVar37,auVar41);
      auVar37._8_4_ = 0x3f7fffff;
      auVar37._0_8_ = 0x3f7fffff3f7fffff;
      auVar37._12_4_ = 0x3f7fffff;
      auVar41 = vminps_avx512vl(auVar41,auVar37);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                ((optional<pbrt::BSDFSample> *)local_68,&local_88,wo_00,auVar38._0_4_,
                 (Point2f)auVar41._0_8_,TVar35,Transmission);
      if (local_3c == true) {
        if (((float)local_68._0_4_ == 0.0) && (!NAN((float)local_68._0_4_))) {
          uVar28 = 0xffffffffffffffff;
          do {
            if (uVar28 == 2) goto LAB_0041136d;
            pfVar3 = afStack_60 + uVar28;
            uVar28 = uVar28 + 1;
          } while ((*pfVar3 == 0.0) && (!NAN(*pfVar3)));
          if (2 < uVar28) goto LAB_0041136d;
        }
        if (((afStack_60[5] != 0.0) || (NAN(afStack_60[5]))) &&
           ((afStack_60[4] != 0.0 || (NAN(afStack_60[4]))))) {
          auVar69._4_4_ = afStack_60[4];
          auVar69._0_4_ = afStack_60[4];
          auVar69._8_4_ = afStack_60[4];
          auVar69._12_4_ = afStack_60[4];
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx512vl(auVar69,auVar5);
          auVar42._4_4_ = afStack_60[5];
          auVar42._0_4_ = afStack_60[5];
          auVar42._8_4_ = afStack_60[5];
          auVar42._12_4_ = afStack_60[5];
          auVar70._0_4_ = auVar38._0_4_ * (float)local_68._0_4_;
          auVar70._4_4_ = auVar38._4_4_ * (float)local_68._4_4_;
          auVar70._8_4_ = auVar38._8_4_ * afStack_60[0];
          auVar70._12_4_ = auVar38._12_4_ * afStack_60[1];
          uVar28 = uVar36 * 0x5851f42d4c957f2d + lVar1;
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.z = afStack_60[4];
          _local_1e8 = vdivps_avx(auVar70,auVar42);
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.x = afStack_60[2];
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.y = afStack_60[3];
          uVar32 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
          bVar31 = (byte)(uVar36 >> 0x3b);
          local_1c8 = ZEXT416((uint)((byte)local_19a & 1) * (int)this->thickness);
          local_18c = this->g;
          auVar20._4_12_ = in_register_00001384;
          auVar20._0_4_ = in_XMM6_Da;
          auVar38 = vcvtusi2ss_avx512f(auVar20,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31);
          auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar36 = uVar28 * 0x5851f42d4c957f2d + lVar1;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar28;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar36;
          auVar41 = vpunpcklqdq_avx(auVar43,auVar71);
          auVar37 = vpsrlvq_avx2(auVar41,_DAT_0044e860);
          auVar40 = vpsrlvq_avx2(auVar41,_DAT_0044e870);
          auVar41 = vpsrlq_avx(auVar41,0x3b);
          auVar41 = vpshufd_avx(auVar41,0xe8);
          uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
          auVar37 = vpshufd_avx(auVar37 ^ auVar40,0xe8);
          auVar41 = vprorvd_avx512vl(auVar37,auVar41);
          auVar41 = vcvtudq2ps_avx512vl(auVar41);
          auVar6._8_4_ = 0x2f800000;
          auVar6._0_8_ = 0x2f8000002f800000;
          auVar6._12_4_ = 0x2f800000;
          auVar41 = vmulps_avx512vl(auVar41,auVar6);
          auVar7._8_4_ = 0x3f7fffff;
          auVar7._0_8_ = 0x3f7fffff3f7fffff;
          auVar7._12_4_ = 0x3f7fffff;
          auVar41 = vminps_avx512vl(auVar41,auVar7);
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                    ((optional<pbrt::BSDFSample> *)local_178,&local_1b0,wo_01,auVar38._0_4_,
                     (Point2f)auVar41._0_8_,local_bc,Transmission);
          TVar35 = TStack_1ec;
          if (local_14c == true) {
            if (((float)local_178._0_4_ == 0.0) && (!NAN((float)local_178._0_4_))) {
              uVar28 = 0xffffffffffffffff;
              do {
                if (uVar28 == 2) goto LAB_0041136d;
                pfVar3 = afStack_170 + uVar28;
                uVar28 = uVar28 + 1;
              } while ((*pfVar3 == 0.0) && (!NAN(*pfVar3)));
              if (2 < uVar28) goto LAB_0041136d;
            }
            if ((((local_168[1].super_Tuple3<pbrt::Vector3,_float>.x != 0.0) ||
                 (NAN(local_168[1].super_Tuple3<pbrt::Vector3,_float>.x))) &&
                ((local_168[0].super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                 (NAN(local_168[0].super_Tuple3<pbrt::Vector3,_float>.z))))) &&
               ((this->config).maxDepth != '\0')) {
              uVar32 = 0;
              auVar38 = vfmadd213ss_fma(ZEXT416((uint)local_18c),ZEXT416((uint)local_18c),
                                        SUB6416(ZEXT464(0x3f800000),0));
              local_194 = local_18c + local_18c;
              auVar41 = vfnmadd213ss_fma(ZEXT416((uint)local_18c),ZEXT416((uint)local_18c),
                                         SUB6416(ZEXT464(0x3f800000),0));
              local_198 = auVar41._0_4_ * 0.07957747;
              local_190 = auVar38._0_4_;
              auVar60 = ZEXT1664(local_1c8);
              do {
                TVar35 = TStack_1ec;
                local_1c8 = auVar60._0_16_;
                local_c0 = uVar32;
                if (3 < uVar32) {
                  auVar61 = ZEXT464((uint)local_1e8);
                  lVar29 = 1;
                  auVar82 = ZEXT464((uint)local_1e8);
                  do {
                    lVar2 = lVar29 * 4;
                    lVar29 = lVar29 + 1;
                    auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar82._0_16_);
                    auVar82 = ZEXT1664(auVar38);
                  } while (lVar29 != 4);
                  if (auVar38._0_4_ < 0.25) {
                    lVar29 = 1;
                    do {
                      lVar2 = lVar29 * 4;
                      lVar29 = lVar29 + 1;
                      auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar61._0_16_);
                      auVar61 = ZEXT1664(auVar38);
                    } while (lVar29 != 4);
                    auVar38 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar38._0_4_)),ZEXT416(0));
                    uVar32 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
                    bVar31 = (byte)(uVar36 >> 0x3b);
                    uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar21._4_12_ = in_register_00001384;
                    auVar21._0_4_ = in_XMM6_Da;
                    auVar41 = vcvtusi2ss_avx512f(auVar21,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31)
                    ;
                    auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    if (auVar41._0_4_ < auVar38._0_4_) break;
                    fVar91 = 1.0 - auVar38._0_4_;
                    auVar44._4_4_ = fVar91;
                    auVar44._0_4_ = fVar91;
                    auVar44._8_4_ = fVar91;
                    auVar44._12_4_ = fVar91;
                    _local_1e8 = vdivps_avx(_local_1e8,auVar44);
                  }
                }
                fVar91 = (this->albedo).values.values[0];
                if ((fVar91 != 0.0) || (NAN(fVar91))) {
LAB_00411504:
                  uVar32 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
                  bVar31 = (byte)(uVar36 >> 0x3b);
                  auVar22._4_12_ = in_register_00001384;
                  auVar22._0_4_ = in_XMM6_Da;
                  auVar38 = vcvtusi2ss_avx512f(auVar22,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31);
                  auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_1d8 = ZEXT416((uint)local_1f8.super_Tuple3<pbrt::Vector3,_float>.z);
                  local_b8 = logf(1.0 - auVar38._0_4_);
                  auVar45._0_12_ = ZEXT412(0);
                  auVar45._12_4_ = 0;
                  uVar4 = vcmpss_avx512f(auVar45,ZEXT416((uint)local_1f8.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                         ,1);
                  local_148._0_2_ = (ushort)uVar4 & 1;
                  fStack_b4 = extraout_XMM0_Db;
                  fStack_b0 = extraout_XMM0_Dc;
                  fStack_ac = extraout_XMM0_Dd;
                  if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                       f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0'
                      ) && (iVar27 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar27 != 0)) {
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                               (PixelAccumFunc)0x0);
                    __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                         ::
                                         f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg);
                    TVar35 = TStack_1ec;
                  }
                  auVar41 = SUB6416(ZEXT464(0x3f800000),0);
                  *(long *)(in_FS_OFFSET + -0x100) = *(long *)(in_FS_OFFSET + -0x100) + 1;
                  auVar8._8_4_ = 0x7fffffff;
                  auVar8._0_8_ = 0x7fffffff7fffffff;
                  auVar8._12_4_ = 0x7fffffff;
                  auVar38 = vandps_avx512vl(local_1d8,auVar8);
                  uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                  fVar91 = -local_b8 / (1.0 / auVar38._0_4_);
                  auVar60 = ZEXT1664(local_1c8);
                  fVar67 = local_1c8._0_4_;
                  fVar91 = fVar67 + (float)((uint)(local_148[0] & 1) * (int)fVar91 +
                                           (uint)!(bool)(local_148[0] & 1) * (int)-fVar91);
                  if ((fVar67 != fVar91) || (NAN(fVar67) || NAN(fVar91))) {
                    if ((fVar91 <= 0.0) || (this->thickness <= fVar91)) {
                      auVar38 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar91));
                      auVar46._0_12_ = ZEXT812(0);
                      auVar46._12_4_ = 0;
                      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar91),auVar46,1);
                      local_1c8._4_12_ = auVar38._4_12_;
                      local_1c8._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar38._0_4_;
                      goto LAB_004116a5;
                    }
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                        local_1b0.top ==
                        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                      auVar38 = vminss_avx(ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_x));
                      fVar67 = auVar38._0_4_;
                    }
                    else {
                      auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                          &(local_1b0.top)->eta)->mfDistrib).alpha_y
                                                  ),ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                                   &(local_1b0.top)->eta)->mfDistrib
                                                                  ).alpha_x));
                      fVar67 = auVar38._0_4_;
                    }
                    if (0.001 <= fVar67) {
                      if (local_14c == false) goto LAB_00412312;
                      auVar38 = vfmadd231ss_fma(ZEXT416((uint)(local_1f8.
                                                               super_Tuple3<pbrt::Vector3,_float>.y
                                                              * local_168[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                              )),
                                                ZEXT416((uint)local_1f8.
                                                              super_Tuple3<pbrt::Vector3,_float>.x),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.x))
                      ;
                      auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)local_1f8.
                                                                                                                                            
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                      ;
                      auVar41 = vfmadd213ss_fma(auVar38,ZEXT416((uint)local_194),ZEXT416(local_190))
                      ;
                      auVar38 = vmaxss_avx(auVar41,ZEXT416(0));
                      auVar38 = vsqrtss_avx(auVar38,auVar38);
                      fVar67 = local_198 / (auVar41._0_4_ * auVar38._0_4_);
                      auVar41 = ZEXT416((uint)((local_168[1].super_Tuple3<pbrt::Vector3,_float>.x *
                                               local_168[1].super_Tuple3<pbrt::Vector3,_float>.x) /
                                              (local_168[1].super_Tuple3<pbrt::Vector3,_float>.x *
                                               local_168[1].super_Tuple3<pbrt::Vector3,_float>.x +
                                              fVar67 * fVar67)));
                    }
                    local_1d8._0_4_ = fVar91;
                    _local_148 = auVar41;
                    if (local_14c == false) goto LAB_00412312;
                    local_b8 = (this->albedo).values.values[0] * (float)local_1e8;
                    fStack_b4 = (this->albedo).values.values[1] * afStack_1e4[0];
                    fStack_b0 = (this->albedo).values.values[2] * afStack_1e4[1];
                    fStack_ac = (this->albedo).values.values[3] * afStack_1e4[2];
                    auVar38 = vfmadd231ss_fma(ZEXT416((uint)(local_1f8.
                                                             super_Tuple3<pbrt::Vector3,_float>.y *
                                                            local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.y)),
                                              ZEXT416((uint)local_1f8.
                                                            super_Tuple3<pbrt::Vector3,_float>.x),
                                              ZEXT416((uint)local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.x));
                    auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)local_1f8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                              ZEXT416((uint)local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.z));
                    afStack_d4[3] = fVar91 - (float)local_98._0_4_;
                    local_c4 = auVar38._0_4_;
                    FVar39 = Tr(afStack_d4[3],local_168);
                    if (local_14c != true) goto LAB_00412312;
                    auVar41 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416((uint)local_194),
                                              ZEXT416(local_190));
                    auVar38 = vmaxss_avx(auVar41,ZEXT816(0));
                    auVar38 = vsqrtss_avx(auVar38,auVar38);
                    fVar91 = local_198 / (auVar41._0_4_ * auVar38._0_4_);
                    auVar48._0_4_ =
                         FVar39 * (float)local_148._0_4_ * fVar91 * local_b8 *
                         (float)local_178._0_4_;
                    auVar48._4_4_ =
                         FVar39 * (float)local_148._0_4_ * fVar91 * fStack_b4 *
                         (float)local_178._4_4_;
                    auVar48._8_4_ =
                         FVar39 * (float)local_148._0_4_ * fVar91 * fStack_b0 * afStack_170[0];
                    auVar48._12_4_ =
                         FVar39 * (float)local_148._0_4_ * fVar91 * fStack_ac * afStack_170[1];
                    auVar9._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar9._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar9._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar9._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    _local_148 = vdivps_avx512vl(auVar48,auVar9);
                    wo_03.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar49._0_8_ =
                         local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar49._8_4_ = 0x80000000;
                    auVar49._12_4_ = 0x80000000;
                    uVar28 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar87._8_8_ = 0;
                    auVar87._0_8_ = uVar36;
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar28;
                    auVar38 = vpunpcklqdq_avx(auVar87,auVar90);
                    auVar41 = vpsrlvq_avx2(auVar38,_DAT_0044e860);
                    auVar37 = vpsrlvq_avx2(auVar38,_DAT_0044e870);
                    auVar38 = vpsrlq_avx(auVar38,0x3b);
                    auVar38 = vpshufd_avx(auVar38,0xe8);
                    auVar41 = vpshufd_avx(auVar41 ^ auVar37,0xe8);
                    auVar38 = vprorvd_avx512vl(auVar41,auVar38);
                    auVar38 = vcvtudq2ps_avx512vl(auVar38);
                    auVar10._8_4_ = 0x2f800000;
                    auVar10._0_8_ = 0x2f8000002f800000;
                    auVar10._12_4_ = 0x2f800000;
                    auVar38 = vmulps_avx512vl(auVar38,auVar10);
                    auVar11._8_4_ = 0x3f7fffff;
                    auVar11._0_8_ = 0x3f7fffff3f7fffff;
                    auVar11._12_4_ = 0x3f7fffff;
                    auVar38 = vminps_avx512vl(auVar38,auVar11);
                    wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar49._0_8_;
                    wo_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar49._0_8_ >> 0x20)
                    ;
                    auVar66 = ZEXT856(auVar49._8_8_);
                    VVar95 = SampleHenyeyGreenstein
                                       (wo_03,local_18c,(Point2f)auVar38._0_8_,(Float *)local_d8);
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.z =
                         VVar95.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar62._0_8_ = VVar95.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar62._8_56_ = auVar66;
                    local_118[0].super_Tuple3<pbrt::Vector3,_float>.y =
                         (float)CONCAT31(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y._1_3_,1);
                    local_188 = local_188 + (float)local_148._0_4_;
                    fStack_184 = fStack_184 + (float)local_148._4_4_;
                    fStack_180 = fStack_180 + fStack_140;
                    fStack_17c = fStack_17c + fStack_13c;
                    local_128 = local_d8;
                    uVar36 = vmovlps_avx(auVar62._0_16_);
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar36 >> 0x20);
                    local_118[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)local_d8;
                    auVar38 = local_1c8;
                    if ((((float)local_d8 != 0.0) || (NAN((float)local_d8))) &&
                       ((VStack_124.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                        (NAN(VStack_124.super_Tuple3<pbrt::Vector3,_float>.z))))) {
                      auVar50._4_4_ = local_d8;
                      auVar50._0_4_ = local_d8;
                      auVar50._8_4_ = local_d8;
                      auVar50._12_4_ = local_d8;
                      auVar74._0_4_ = (float)local_d8 * (this->albedo).values.values[0];
                      auVar74._4_4_ = (float)local_d8 * (this->albedo).values.values[1];
                      auVar74._8_4_ = (float)local_d8 * (this->albedo).values.values[2];
                      auVar74._12_4_ = (float)local_d8 * (this->albedo).values.values[3];
                      auVar38 = vdivps_avx(auVar74,auVar50);
                      afStack_1e4[0] = auVar38._4_4_ * afStack_1e4[0];
                      local_1e8 = (undefined1  [4])(auVar38._0_4_ * (float)local_1e8);
                      afStack_1e4[1] = auVar38._8_4_ * afStack_1e4[1];
                      afStack_1e4[2] = auVar38._12_4_ * afStack_1e4[2];
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          local_1b0.top ==
                          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                        auVar38 = vminss_avx(ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_x))
                        ;
                        fVar91 = auVar38._0_4_;
                      }
                      else {
                        auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_1b0.top)->eta)->mfDistrib).
                                                           alpha_y),
                                             ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_1b0.top)->eta)->mfDistrib).
                                                           alpha_x));
                        fVar91 = auVar38._0_4_;
                      }
                      local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar36;
                      local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                           VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                      if (0.001 <= fVar91) {
                        auVar81._0_4_ = -VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar81._4_4_ = 0x80000000;
                        auVar81._8_4_ = 0x80000000;
                        auVar81._12_4_ = 0x80000000;
                        auVar57._0_8_ = uVar36 ^ 0x8000000080000000;
                        auVar57._8_4_ = 0x80000000;
                        auVar57._12_4_ = 0x80000000;
                        wo_08.super_Tuple3<pbrt::Vector3,_float>.z = auVar81._0_4_;
                        wo_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar57._0_8_;
                        wo_08.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar57._0_8_ >> 0x20);
                        auVar86 = ZEXT856(auVar81._8_8_);
                        auVar66 = ZEXT856(auVar57._8_8_);
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                        SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::f(&local_1b0,wo_08,wi_04,TVar35);
                        auVar85._0_8_ = SVar94.values.values._8_8_;
                        auVar85._8_56_ = auVar86;
                        auVar65._0_8_ = SVar94.values.values._0_8_;
                        auVar65._8_56_ = auVar66;
                        _local_d8 = vmovlhps_avx(auVar65._0_16_,auVar85._0_16_);
                        if ((SVar94.values.values[0] == 0.0) && (!NAN(SVar94.values.values[0]))) {
                          uVar36 = 0xffffffffffffffff;
                          do {
                            auVar38 = ZEXT416((uint)local_1d8._0_4_);
                            if (uVar36 == 2) goto LAB_00412108;
                            lVar29 = uVar36 * 4;
                            uVar36 = uVar36 + 1;
                          } while ((*(float *)(local_d8 + lVar29 + 8) == 0.0) &&
                                  (!NAN(*(float *)(local_d8 + lVar29 + 8))));
                          if (2 < uVar36) goto LAB_00412102;
                        }
                        auVar88._8_4_ = 0x80000000;
                        auVar88._0_8_ = 0x8000000080000000;
                        auVar88._12_4_ = 0x80000000;
                        auVar58._8_8_ = 0;
                        auVar58._0_4_ = local_1f8.super_Tuple3<pbrt::Vector3,_float>.x;
                        auVar58._4_4_ = local_1f8.super_Tuple3<pbrt::Vector3,_float>.y;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB168(auVar58 ^ auVar88,0)
                        ;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                             SUB164(ZEXT416((uint)local_1f8.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                    auVar88,0);
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                        FVar39 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(&local_1b0,wo_09,wi_05,TVar35,Transmission);
                        local_1c8._0_4_ = FVar39;
                        if (local_118[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\0') {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
                        }
                        local_148._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.x;
                        FVar39 = Tr(afStack_d4[3],&VStack_124);
                        fVar91 = ((float)local_148._0_4_ * (float)local_148._0_4_) /
                                 ((float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                                 (float)local_148._0_4_ * (float)local_148._0_4_);
                        local_188 = fVar91 * FVar39 * (float)local_1e8 * (float)local_d8 + local_188
                        ;
                        fStack_184 = fVar91 * FVar39 * afStack_1e4[0] * afStack_d4[0] + fStack_184;
                        fStack_180 = fVar91 * FVar39 * afStack_1e4[1] * afStack_d4[1] + fStack_180;
                        fStack_17c = fVar91 * FVar39 * afStack_1e4[2] * afStack_d4[2] + fStack_17c;
                      }
LAB_00412102:
                      auVar38 = ZEXT416((uint)local_1d8._0_4_);
                    }
LAB_00412108:
                    auVar60 = ZEXT1664(auVar38);
                    uVar36 = uVar28 * 0x5851f42d4c957f2d + lVar1;
                  }
                  else {
                    *(long *)(in_FS_OFFSET + -0x108) = *(long *)(in_FS_OFFSET + -0x108) + 1;
                  }
                }
                else {
                  uVar28 = 0;
                  do {
                    uVar30 = uVar28;
                    if (uVar30 == 3) goto LAB_00411615;
                    fVar91 = (this->albedo).values.values[uVar30 + 1];
                  } while ((fVar91 == 0.0) && (uVar28 = uVar30 + 1, !NAN(fVar91)));
                  if (uVar30 < 3) goto LAB_00411504;
LAB_00411615:
                  FVar39 = this->thickness;
                  local_1c8._0_4_ = auVar60._0_4_;
                  uVar4 = vcmpss_avx512f(ZEXT416((uint)FVar39),ZEXT416((uint)local_1c8._0_4_),0);
                  local_1c8 = ZEXT416((uint)!(bool)((byte)uVar4 & 1) * (int)FVar39);
                  FVar39 = Tr(FVar39,&local_1f8);
                  afStack_1e4[0] = FVar39 * afStack_1e4[0];
                  local_1e8 = (undefined1  [4])(FVar39 * (float)local_1e8);
                  afStack_1e4[1] = FVar39 * afStack_1e4[1];
                  afStack_1e4[2] = FVar39 * afStack_1e4[2];
LAB_004116a5:
                  bVar31 = (byte)(uVar36 >> 0x38);
                  uVar32 = (uint)(uVar36 >> 0x20);
                  if ((local_1c8._0_4_ != (float)local_98._0_4_) ||
                     (NAN(local_1c8._0_4_) || NAN((float)local_98._0_4_))) {
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                        local_f8.top ==
                        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                      auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                          &(local_f8.bottom)->mfDistrib)->tint).
                                                         values.values[0]),
                                           ZEXT416((uint)((DielectricInterfaceBxDF *)
                                                         &(local_f8.bottom)->mfDistrib)->eta));
                      fVar91 = auVar38._0_4_;
                    }
                    else {
                      auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                          &(local_f8.top)->eta)->mfDistrib).alpha_y)
                                           ,ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                           &(local_f8.top)->eta)->mfDistrib).alpha_x
                                                   ));
                      fVar91 = auVar38._0_4_;
                    }
                    if (0.001 <= fVar91) {
                      auVar75 = SUB6416(ZEXT464(0x3f800000),0);
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          local_1b0.top ==
                          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                        auVar38 = vminss_avx(ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_x))
                        ;
                        fVar91 = auVar38._0_4_;
                      }
                      else {
                        auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_1b0.top)->eta)->mfDistrib).
                                                           alpha_y),
                                             ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_1b0.top)->eta)->mfDistrib).
                                                           alpha_x));
                        fVar91 = auVar38._0_4_;
                      }
                      if (0.001 <= fVar91) {
                        if (local_14c == false) goto LAB_00412312;
                        local_1d8._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                        wo_04.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                        wi_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                      local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                             0x8000000080000000;
                        wi_01.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        FVar39 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(&local_f8,wo_04,wi_01,TVar35,All);
                        auVar75._0_4_ =
                             ((float)local_1d8._0_4_ * (float)local_1d8._0_4_) /
                             ((float)local_1d8._0_4_ * (float)local_1d8._0_4_ + FVar39 * FVar39);
                        auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      }
                      local_1d8 = auVar75;
                      if (local_14c == false) {
LAB_00412312:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
                      }
                      auVar76._0_4_ = -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar76._4_4_ = 0x80000000;
                      auVar76._8_4_ = 0x80000000;
                      auVar76._12_4_ = 0x80000000;
                      wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                           -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar51._0_8_ =
                           local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar51._8_4_ = 0x80000000;
                      auVar51._12_4_ = 0x80000000;
                      wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                    local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                           0x8000000080000000;
                      wo_05.super_Tuple3<pbrt::Vector3,_float>.z = auVar76._0_4_;
                      wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar51._0_8_;
                      wo_05.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar51._0_8_ >> 0x20);
                      auVar86 = ZEXT856(auVar76._8_8_);
                      auVar66 = ZEXT856(auVar51._8_8_);
                      SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               f(&local_f8,wo_05,wi_02,TVar35);
                      auVar83._0_8_ = SVar94.values.values._8_8_;
                      auVar83._8_56_ = auVar86;
                      auVar63._0_8_ = SVar94.values.values._0_8_;
                      auVar63._8_56_ = auVar66;
                      if (local_14c != true) goto LAB_00412312;
                      auVar38 = vmovlhps_avx(auVar63._0_16_,auVar83._0_16_);
                      local_148._4_4_ = auVar38._4_4_ * afStack_1e4[0];
                      local_148._0_4_ = auVar38._0_4_ * (float)local_1e8;
                      fStack_140 = auVar38._8_4_ * afStack_1e4[1];
                      fStack_13c = auVar38._12_4_ * afStack_1e4[2];
                      local_b8 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_b4 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_b0 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_ac = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      FVar39 = Tr(this->thickness,local_168);
                      if (local_14c != true) goto LAB_00412312;
                      auVar26._4_4_ = fStack_b4;
                      auVar26._0_4_ = local_b8;
                      auVar26._8_4_ = fStack_b0;
                      auVar26._12_4_ = fStack_ac;
                      auVar15._8_4_ = 0x7fffffff;
                      auVar15._0_8_ = 0x7fffffff7fffffff;
                      auVar15._12_4_ = 0x7fffffff;
                      auVar38 = vandps_avx512vl(auVar26,auVar15);
                      auVar52._0_4_ =
                           FVar39 * (float)local_1d8._0_4_ * auVar38._0_4_ * (float)local_148._0_4_
                           * (float)local_178._0_4_;
                      auVar52._4_4_ =
                           FVar39 * (float)local_1d8._0_4_ * auVar38._4_4_ * (float)local_148._4_4_
                           * (float)local_178._4_4_;
                      auVar52._8_4_ =
                           FVar39 * (float)local_1d8._0_4_ * auVar38._8_4_ * fStack_140 *
                           afStack_170[0];
                      auVar52._12_4_ =
                           FVar39 * (float)local_1d8._0_4_ * auVar38._12_4_ * fStack_13c *
                           afStack_170[1];
                      auVar16._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar38 = vdivps_avx512vl(auVar52,auVar16);
                      local_188 = auVar38._0_4_ + local_188;
                      fStack_184 = auVar38._4_4_ + fStack_184;
                      fStack_180 = auVar38._8_4_ + fStack_180;
                      fStack_17c = auVar38._12_4_ + fStack_17c;
                    }
                    auVar93._8_4_ = 0x80000000;
                    auVar93._0_8_ = 0x8000000080000000;
                    auVar93._12_4_ = 0x80000000;
                    uVar32 = uVar32 >> 0xd ^ (uint)(uVar36 >> 0x1b);
                    bVar31 = bVar31 >> 3;
                    auVar24._4_12_ = in_register_00001384;
                    auVar24._0_4_ = in_XMM6_Da;
                    auVar38 = vcvtusi2ss_avx512f(auVar24,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31)
                    ;
                    uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    uVar28 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = uVar36;
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar28;
                    auVar41 = vpunpcklqdq_avx(auVar53,auVar77);
                    auVar37 = vpsrlvq_avx2(auVar41,_DAT_0044e860);
                    auVar40 = vpsrlvq_avx2(auVar41,_DAT_0044e870);
                    auVar41 = vpsrlq_avx(auVar41,0x3b);
                    auVar41 = vpshufd_avx(auVar41,0xe8);
                    auVar37 = vpshufd_avx(auVar37 ^ auVar40,0xe8);
                    auVar41 = vprorvd_avx512vl(auVar37,auVar41);
                    auVar41 = vcvtudq2ps_avx512vl(auVar41);
                    auVar17._8_4_ = 0x2f800000;
                    auVar17._0_8_ = 0x2f8000002f800000;
                    auVar17._12_4_ = 0x2f800000;
                    auVar41 = vmulps_avx512vl(auVar41,auVar17);
                    auVar18._8_4_ = 0x3f7fffff;
                    auVar18._0_8_ = 0x3f7fffff3f7fffff;
                    auVar18._12_4_ = 0x3f7fffff;
                    auVar41 = vminps_avx512vl(auVar41,auVar18);
                    auVar54._8_8_ = 0;
                    auVar54._0_4_ = local_1f8.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar54._4_4_ = local_1f8.super_Tuple3<pbrt::Vector3,_float>.y;
                    wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB168(auVar54 ^ auVar93,0);
                    wo_06.super_Tuple3<pbrt::Vector3,_float>.z =
                         SUB164(ZEXT416((uint)local_1f8.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                auVar93,0);
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_128,&local_f8,wo_06,auVar38._0_4_
                               ,(Point2f)auVar41._0_8_,TStack_1ec,Reflection);
                    TVar35 = TStack_1ec;
                    uVar36 = uVar28 * 0x5851f42d4c957f2d + lVar1;
                    if (local_fc != true) break;
                    if (((float)local_128 == 0.0) && (!NAN((float)local_128))) {
                      uVar28 = 0xffffffffffffffff;
                      do {
                        if (uVar28 == 2) goto LAB_0041136d;
                        fVar91 = (&VStack_124.super_Tuple3<pbrt::Vector3,_float>.y)[uVar28];
                        uVar28 = uVar28 + 1;
                      } while ((fVar91 == 0.0) && (!NAN(fVar91)));
                      if (2 < uVar28) break;
                    }
                    if (((local_118[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_118[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_118[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_118[0].super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                    auVar78._4_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar78._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar78._8_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar78._12_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar19._8_4_ = 0x7fffffff;
                    auVar19._0_8_ = 0x7fffffff7fffffff;
                    auVar19._12_4_ = 0x7fffffff;
                    auVar38 = vandps_avx512vl(auVar78,auVar19);
                    auVar55._4_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._0_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._8_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._12_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar79._0_4_ = auVar38._0_4_ * (float)local_128;
                    auVar79._4_4_ = auVar38._4_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar79._8_4_ = auVar38._8_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar79._12_4_ =
                         auVar38._12_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_118[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    auVar38 = vdivps_avx(auVar79,auVar55);
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    afStack_1e4[0] = auVar38._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar38._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar38._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar38._12_4_ * afStack_1e4[2];
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                        local_1b0.top ==
                        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                      auVar38 = vminss_avx(ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_1b0.bottom)->mfDistrib).alpha_x));
                      fVar91 = auVar38._0_4_;
                    }
                    else {
                      auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                          &(local_1b0.top)->eta)->mfDistrib).alpha_y
                                                  ),ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                                   &(local_1b0.top)->eta)->mfDistrib
                                                                  ).alpha_x));
                      fVar91 = auVar38._0_4_;
                    }
                    if (0.001 <= fVar91) {
                      auVar80._0_4_ = -local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar80._4_4_ = 0x80000000;
                      auVar80._8_4_ = 0x80000000;
                      auVar80._12_4_ = 0x80000000;
                      auVar56._0_8_ =
                           local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar56._8_4_ = 0x80000000;
                      auVar56._12_4_ = 0x80000000;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.z = auVar80._0_4_;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar56._0_8_;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar56._0_8_ >> 0x20);
                      auVar86 = ZEXT856(auVar80._8_8_);
                      auVar66 = ZEXT856(auVar56._8_8_);
                      wi_03.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
                      wi_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                      wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                      SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               f(&local_1b0,wo_07,wi_03,TStack_1ec);
                      auVar84._0_8_ = SVar94.values.values._8_8_;
                      auVar84._8_56_ = auVar86;
                      auVar64._0_8_ = SVar94.values.values._0_8_;
                      auVar64._8_56_ = auVar66;
                      _local_d8 = vmovlhps_avx(auVar64._0_16_,auVar84._0_16_);
                      if ((SVar94.values.values[0] == 0.0) && (!NAN(SVar94.values.values[0]))) {
                        uVar28 = 0xffffffffffffffff;
                        do {
                          if (uVar28 == 2) goto LAB_0041223d;
                          lVar29 = uVar28 * 4;
                          uVar28 = uVar28 + 1;
                        } while ((*(float *)(local_d8 + lVar29 + 8) == 0.0) &&
                                (!NAN(*(float *)(local_d8 + lVar29 + 8))));
                        if (2 < uVar28) goto LAB_0041223d;
                      }
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          local_f8.top ==
                          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
                        auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_f8.bottom)->mfDistrib)->tint).
                                                           values.values[0]),
                                             ZEXT416((uint)((DielectricInterfaceBxDF *)
                                                           &(local_f8.bottom)->mfDistrib)->eta));
                        fVar91 = auVar38._0_4_;
                      }
                      else {
                        auVar38 = vminss_avx(ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_f8.top)->eta)->mfDistrib).
                                                           alpha_y),
                                             ZEXT416((uint)(((DielectricInterfaceBxDF *)
                                                            &(local_f8.top)->eta)->mfDistrib).
                                                           alpha_x));
                        fVar91 = auVar38._0_4_;
                      }
                      if (0.001 <= fVar91) {
                        wo_10.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                        FVar39 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(&local_1b0,wo_10,wi_06,TVar35,Transmission);
                        if (local_fc == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
                        }
                        local_1d8 = ZEXT416((uint)((local_118[1].super_Tuple3<pbrt::Vector3,_float>.
                                                    x * local_118[1].
                                                        super_Tuple3<pbrt::Vector3,_float>.x) /
                                                  (FVar39 * FVar39 +
                                                  local_118[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                  * local_118[1].super_Tuple3<pbrt::Vector3,_float>.
                                                    x)));
                      }
                      else {
                        local_1d8 = SUB6416(ZEXT464(0x3f800000),0);
                      }
                      if ((local_fc & 1U) == 0) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
                      }
                      FVar39 = Tr(this->thickness,local_118);
                      local_188 = (float)local_1d8._0_4_ *
                                  FVar39 * (float)local_1e8 * (float)local_d8 + local_188;
                      fStack_184 = (float)local_1d8._0_4_ * FVar39 * afStack_1e4[0] * afStack_d4[0]
                                   + fStack_184;
                      fStack_180 = (float)local_1d8._0_4_ * FVar39 * afStack_1e4[1] * afStack_d4[1]
                                   + fStack_180;
                      fStack_17c = (float)local_1d8._0_4_ * FVar39 * afStack_1e4[2] * afStack_d4[2]
                                   + fStack_17c;
                    }
                  }
                  else {
                    uVar32 = uVar32 >> 0xd ^ (uint)(uVar36 >> 0x1b);
                    bVar31 = bVar31 >> 3;
                    auVar23._4_12_ = in_register_00001384;
                    auVar23._0_4_ = in_XMM6_Da;
                    auVar38 = vcvtusi2ss_avx512f(auVar23,uVar32 >> bVar31 | uVar32 << 0x20 - bVar31)
                    ;
                    uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    wo_02.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                    wo_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    uVar28 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar36;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar28;
                    auVar41 = vpunpcklqdq_avx(auVar89,auVar92);
                    auVar37 = vpsrlvq_avx2(auVar41,_DAT_0044e860);
                    auVar40 = vpsrlvq_avx2(auVar41,_DAT_0044e870);
                    auVar41 = vpsrlq_avx(auVar41,0x3b);
                    auVar41 = vpshufd_avx(auVar41,0xe8);
                    uVar36 = uVar28 * 0x5851f42d4c957f2d + lVar1;
                    auVar37 = vpshufd_avx(auVar37 ^ auVar40,0xe8);
                    auVar41 = vprorvd_avx512vl(auVar37,auVar41);
                    auVar41 = vcvtudq2ps_avx512vl(auVar41);
                    auVar12._8_4_ = 0x2f800000;
                    auVar12._0_8_ = 0x2f8000002f800000;
                    auVar12._12_4_ = 0x2f800000;
                    auVar41 = vmulps_avx512vl(auVar41,auVar12);
                    auVar13._8_4_ = 0x3f7fffff;
                    auVar13._0_8_ = 0x3f7fffff3f7fffff;
                    auVar13._12_4_ = 0x3f7fffff;
                    auVar41 = vminps_avx512vl(auVar41,auVar13);
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_128,&local_1b0,wo_02,
                               auVar38._0_4_,(Point2f)auVar41._0_8_,TVar35,Reflection);
                    TVar35 = TStack_1ec;
                    if (local_fc != true) break;
                    if (((float)local_128 == 0.0) && (!NAN((float)local_128))) {
                      uVar28 = 0xffffffffffffffff;
                      do {
                        if (uVar28 == 2) goto LAB_0041136d;
                        fVar91 = (&VStack_124.super_Tuple3<pbrt::Vector3,_float>.y)[uVar28];
                        uVar28 = uVar28 + 1;
                      } while ((fVar91 == 0.0) && (!NAN(fVar91)));
                      if (2 < uVar28) break;
                    }
                    if (((local_118[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_118[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_118[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_118[0].super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                    auVar72._4_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar72._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar72._8_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar72._12_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar14._8_4_ = 0x7fffffff;
                    auVar14._0_8_ = 0x7fffffff7fffffff;
                    auVar14._12_4_ = 0x7fffffff;
                    auVar38 = vandps_avx512vl(auVar72,auVar14);
                    auVar47._4_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar47._0_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar47._8_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar47._12_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar73._0_4_ = auVar38._0_4_ * (float)local_128;
                    auVar73._4_4_ = auVar38._4_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar73._8_4_ = auVar38._8_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar73._12_4_ =
                         auVar38._12_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_118[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    auVar38 = vdivps_avx(auVar73,auVar47);
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    afStack_1e4[0] = auVar38._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar38._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar38._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar38._12_4_ * afStack_1e4[2];
                  }
LAB_0041223d:
                  auVar60 = ZEXT1664(local_1c8);
                }
                uVar32 = local_c0 + 1;
                TVar35 = TStack_1ec;
              } while (uVar32 < (this->config).maxDepth);
            }
          }
        }
      }
LAB_0041136d:
      bVar31 = (this->config).nSamples;
      uVar34 = uVar34 + 1;
    } while (uVar34 < bVar31);
    fVar91 = (float)bVar31;
  }
  auVar25._4_4_ = fStack_184;
  auVar25._0_4_ = local_188;
  auVar25._8_4_ = fStack_180;
  auVar25._12_4_ = fStack_17c;
  auVar59._4_4_ = fVar91;
  auVar59._0_4_ = fVar91;
  auVar59._8_4_ = fVar91;
  auVar59._12_4_ = fVar91;
  auVar38 = vdivps_avx(auVar25,auVar59);
  auVar41 = vshufpd_avx(auVar38,auVar38,1);
  SVar94.values.values._0_8_ = auVar38._0_8_;
  SVar94.values.values._8_8_ = auVar41._0_8_;
  return (SampledSpectrum)SVar94.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Vector3f w = wos->wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        pstd::optional<PhaseFunctionSample> ps =
                            phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / config.nSamples;
    }